

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O1

Result GetOpt::convert<int>(string *s,int *result,fmtflags flags)

{
  uint uVar1;
  Result RVar2;
  stringstream ss;
  long local_1a8 [2];
  ostream local_198 [8];
  fmtflags afStack_190 [26];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::ios::clear((int)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  *(fmtflags *)((long)afStack_190 + *(long *)(local_1a8[0] + -0x18)) = flags;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::istream::operator>>((istream *)local_1a8,result);
  uVar1 = *(uint *)((long)afStack_190 + *(long *)(local_1a8[0] + -0x18) + 8);
  RVar2 = BadType;
  if ((uVar1 & 5) == 0) {
    RVar2 = (uint)((uVar1 & 2) == 0) * 3;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return RVar2;
}

Assistant:

inline _Option::Result convert(const std::string& s, T& result, std::ios::fmtflags flags)
{
    std::stringstream ss;
    ss.clear();
    ss.flags(flags);
    ss << s;
    ss >> result;
    if (ss.fail() || !ss.eof())
        return _Option::BadType;
    else
        return _Option::OK;
}